

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_post_effects.cpp
# Opt level: O1

ON_XMLVariant * __thiscall
ON_PostEffect::CImpl::GetPropertyValue
          (ON_XMLVariant *__return_storage_ptr__,CImpl *this,wchar_t *name)

{
  int iVar1;
  ON_XMLNode *pOVar2;
  undefined4 extraout_var;
  ON_XMLVariant *src;
  long *plVar3;
  
  ::ON_XMLVariant::ON_XMLVariant(__return_storage_ptr__);
  pOVar2 = PepNode(this);
  if (pOVar2 != (ON_XMLNode *)0x0) {
    iVar1 = (*pOVar2->_vptr_ON_XMLNode[0x26])(pOVar2,name);
    plVar3 = (long *)CONCAT44(extraout_var,iVar1);
    if (plVar3 != (long *)0x0) {
      src = (ON_XMLVariant *)(**(code **)(*plVar3 + 0x38))(plVar3);
      ::ON_XMLVariant::operator=(__return_storage_ptr__,src);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ON_XMLVariant ON_PostEffect::CImpl::GetPropertyValue(const wchar_t* name) const
{
  ON_XMLVariant v;

  const auto* pep_node = PepNode();
  if (nullptr != pep_node)
  {
    const ON_XMLProperty* pProp = pep_node->GetNamedProperty(name);
    if (nullptr != pProp)
    {
      v = pProp->GetValue();
    }
  }

  return v;
}